

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O0

bool bssl::marshal_CA_names
               (stack_st_CRYPTO_BUFFER *config_names,stack_st_CRYPTO_BUFFER *ctx_names,CBB *cbb)

{
  bool bVar1;
  int iVar2;
  Type *buf;
  uint8_t *data;
  size_t len;
  StackIterator<stack_st_CRYPTO_BUFFER> other;
  stack_st_CRYPTO_BUFFER *local_d8;
  CRYPTO_BUFFER *name;
  StackIterator<stack_st_CRYPTO_BUFFER> __end1;
  StackIterator<stack_st_CRYPTO_BUFFER> __begin1;
  stack_st_CRYPTO_BUFFER **__range1;
  CBB name_cbb;
  CBB child;
  stack_st_CRYPTO_BUFFER *names;
  CBB *cbb_local;
  stack_st_CRYPTO_BUFFER *ctx_names_local;
  stack_st_CRYPTO_BUFFER *config_names_local;
  
  local_d8 = config_names;
  if (config_names == (stack_st_CRYPTO_BUFFER *)0x0) {
    local_d8 = ctx_names;
  }
  iVar2 = CBB_add_u16_length_prefixed(cbb,(CBB *)((long)&name_cbb.u + 0x18));
  if (iVar2 == 0) {
    config_names_local._7_1_ = false;
  }
  else if (local_d8 == (stack_st_CRYPTO_BUFFER *)0x0) {
    iVar2 = CBB_flush(cbb);
    config_names_local._7_1_ = iVar2 != 0;
  }
  else {
    join_0x00000010_0x00000000_ = begin<stack_st_CRYPTO_BUFFER>(local_d8);
    other = end<stack_st_CRYPTO_BUFFER>(local_d8);
    while (bVar1 = internal::StackIteratorImpl<stack_st_CRYPTO_BUFFER>::operator!=
                             ((StackIteratorImpl<stack_st_CRYPTO_BUFFER> *)&__end1.idx_,other),
          bVar1) {
      buf = internal::StackIteratorImpl<stack_st_CRYPTO_BUFFER>::operator*
                      ((StackIteratorImpl<stack_st_CRYPTO_BUFFER> *)&__end1.idx_);
      iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&name_cbb.u + 0x18),(CBB *)&__range1);
      if (iVar2 == 0) {
        return false;
      }
      data = CRYPTO_BUFFER_data(buf);
      len = CRYPTO_BUFFER_len(buf);
      iVar2 = CBB_add_bytes((CBB *)&__range1,data,len);
      if (iVar2 == 0) {
        return false;
      }
      internal::StackIteratorImpl<stack_st_CRYPTO_BUFFER>::operator++
                ((StackIteratorImpl<stack_st_CRYPTO_BUFFER> *)&__end1.idx_);
    }
    iVar2 = CBB_flush(cbb);
    config_names_local._7_1_ = iVar2 != 0;
  }
  return config_names_local._7_1_;
}

Assistant:

static bool marshal_CA_names(const STACK_OF(CRYPTO_BUFFER) *config_names,
                             const STACK_OF(CRYPTO_BUFFER) *ctx_names,
                             CBB *cbb) {
  const STACK_OF(CRYPTO_BUFFER) *names =
      config_names == nullptr ? ctx_names : config_names;
  CBB child, name_cbb;

  if (!CBB_add_u16_length_prefixed(cbb, &child)) {
    return false;
  }

  if (names == nullptr) {
    return CBB_flush(cbb);
  }

  for (const CRYPTO_BUFFER *name : names) {
    if (!CBB_add_u16_length_prefixed(&child, &name_cbb) ||
        !CBB_add_bytes(&name_cbb, CRYPTO_BUFFER_data(name),
                       CRYPTO_BUFFER_len(name))) {
      return false;
    }
  }

  return CBB_flush(cbb);
}